

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O2

void __thiscall sf::RenderTarget::applyTransform(RenderTarget *this,Transform *transform)

{
  PFNGLLOADMATRIXFPROC UNRECOVERED_JUMPTABLE;
  bool bVar1;
  float *pfVar2;
  
  bVar1 = operator==(transform,(Transform *)Transform::Identity);
  UNRECOVERED_JUMPTABLE = sf_glad_glLoadMatrixf;
  if (bVar1) {
    (*sf_glad_glLoadIdentity)();
    return;
  }
  pfVar2 = Transform::getMatrix(transform);
  (*UNRECOVERED_JUMPTABLE)(pfVar2);
  return;
}

Assistant:

void RenderTarget::applyTransform(const Transform& transform)
{
    // No need to call glMatrixMode(GL_MODELVIEW), it is always the
    // current mode (for optimization purpose, since it's the most used)
    if (transform == Transform::Identity)
        glCheck(glLoadIdentity());
    else
        glCheck(glLoadMatrixf(transform.getMatrix()));
}